

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O2

void test_read_format_rar_multivolume_uncompressed_files_helper(archive *a)

{
  la_int64_t lVar1;
  la_ssize_t lVar2;
  char buff [64];
  
  lVar1 = archive_seek_data(a,0,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'٠',0,"0",lVar1,"archive_seek_data(a, 0, SEEK_SET)",a);
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  buff[0x10] = '\0';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  buff[0x14] = '\0';
  buff[0x15] = '\0';
  buff[0x16] = '\0';
  buff[0x17] = '\0';
  buff[0x18] = '\0';
  buff[0x19] = '\0';
  buff[0x1a] = '\0';
  buff[0x1b] = '\0';
  buff[0x1c] = '\0';
  buff[0x1d] = '\0';
  buff[0x1e] = '\0';
  buff[0x1f] = '\0';
  buff[0x20] = '\0';
  buff[0x21] = '\0';
  buff[0x22] = '\0';
  buff[0x23] = '\0';
  buff[0x24] = '\0';
  buff[0x25] = '\0';
  buff[0x26] = '\0';
  buff[0x27] = '\0';
  buff[0x28] = '\0';
  buff[0x29] = '\0';
  buff[0x2a] = '\0';
  buff[0x2b] = '\0';
  buff[0x2c] = '\0';
  buff[0x2d] = '\0';
  buff[0x2e] = '\0';
  buff[0x2f] = '\0';
  buff[0x30] = '\0';
  buff[0x31] = '\0';
  buff[0x32] = '\0';
  buff[0x33] = '\0';
  buff[0x34] = '\0';
  buff[0x35] = '\0';
  buff[0x36] = '\0';
  buff[0x37] = '\0';
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  buff[0x3c] = '\0';
  buff[0x3d] = '\0';
  buff[0x3e] = '\0';
  buff[0x3f] = '\0';
  lVar1 = archive_seek_data(a,-0x3f,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'٢',-1,"-1",lVar1,"archive_seek_data(a, -((int)sizeof(buff)-1), SEEK_SET)",
                      a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'٣',0,"0",lVar1,"archive_seek_data(a, 0, SEEK_CUR)",a);
  lVar2 = archive_read_data(a,buff,0x3f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'٥',0x3f,"(sizeof(buff)-1)",lVar2,
                      "archive_read_data(a, buff, (sizeof(buff)-1))",a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'٦',0x3f,"(sizeof(buff)-1)",lVar1,"archive_seek_data(a, 0, SEEK_CUR)",a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'٨',"<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0 Transitional//EN\">\n",
             "\"<!DOCTYPE HTML PUBLIC \\\"-//W3C//DTD \" \"HTML 4.0 Transitional//EN\\\">\\n\"",buff
             ,"buff",a,L'\0');
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  buff[0x10] = '\0';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  buff[0x14] = '\0';
  buff[0x15] = '\0';
  buff[0x16] = '\0';
  buff[0x17] = '\0';
  buff[0x18] = '\0';
  buff[0x19] = '\0';
  buff[0x1a] = '\0';
  buff[0x1b] = '\0';
  buff[0x1c] = '\0';
  buff[0x1d] = '\0';
  buff[0x1e] = '\0';
  buff[0x1f] = '\0';
  buff[0x20] = '\0';
  buff[0x21] = '\0';
  buff[0x22] = '\0';
  buff[0x23] = '\0';
  buff[0x24] = '\0';
  buff[0x25] = '\0';
  buff[0x26] = '\0';
  buff[0x27] = '\0';
  buff[0x28] = '\0';
  buff[0x29] = '\0';
  buff[0x2a] = '\0';
  buff[0x2b] = '\0';
  buff[0x2c] = '\0';
  buff[0x2d] = '\0';
  buff[0x2e] = '\0';
  buff[0x2f] = '\0';
  buff[0x30] = '\0';
  buff[0x31] = '\0';
  buff[0x32] = '\0';
  buff[0x33] = '\0';
  buff[0x34] = '\0';
  buff[0x35] = '\0';
  buff[0x36] = '\0';
  buff[0x37] = '\0';
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  buff[0x3c] = '\0';
  buff[0x3d] = '\0';
  buff[0x3e] = '\0';
  buff[0x3f] = '\0';
  lVar1 = archive_seek_data(a,-0x7e,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'٪',-1,"-1",lVar1,
                      "archive_seek_data(a, -(((int)sizeof(buff)-1)*2), SEEK_CUR)",a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'٫',0x3f,"(sizeof(buff)-1)",lVar1,"archive_seek_data(a, 0, SEEK_CUR)",a);
  lVar2 = archive_read_data(a,buff,0x3f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'٭',0x3f,"(sizeof(buff)-1)",lVar2,
                      "archive_read_data(a, buff, (sizeof(buff)-1))",a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٮ',0x7e,"((sizeof(buff)-1)*2)",lVar1,"archive_seek_data(a, 0, SEEK_CUR)",a
                     );
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ٰ',"<HTML>\n<HEAD>\n\t<META HTTP-EQUIV=\"CONTENT-TYPE\" CONTENT=\"text/ht",
             "\"<HTML>\\n<HEAD>\\n\\t<META HTTP-EQUIV=\\\"CONTENT-TYPE\\\" \" \"CONTENT=\\\"text/ht\""
             ,buff,"buff",a,L'\0');
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  buff[0x10] = '\0';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  buff[0x14] = '\0';
  buff[0x15] = '\0';
  buff[0x16] = '\0';
  buff[0x17] = '\0';
  buff[0x18] = '\0';
  buff[0x19] = '\0';
  buff[0x1a] = '\0';
  buff[0x1b] = '\0';
  buff[0x1c] = '\0';
  buff[0x1d] = '\0';
  buff[0x1e] = '\0';
  buff[0x1f] = '\0';
  buff[0x20] = '\0';
  buff[0x21] = '\0';
  buff[0x22] = '\0';
  buff[0x23] = '\0';
  buff[0x24] = '\0';
  buff[0x25] = '\0';
  buff[0x26] = '\0';
  buff[0x27] = '\0';
  buff[0x28] = '\0';
  buff[0x29] = '\0';
  buff[0x2a] = '\0';
  buff[0x2b] = '\0';
  buff[0x2c] = '\0';
  buff[0x2d] = '\0';
  buff[0x2e] = '\0';
  buff[0x2f] = '\0';
  buff[0x30] = '\0';
  buff[0x31] = '\0';
  buff[0x32] = '\0';
  buff[0x33] = '\0';
  buff[0x34] = '\0';
  buff[0x35] = '\0';
  buff[0x36] = '\0';
  buff[0x37] = '\0';
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  buff[0x3c] = '\0';
  buff[0x3d] = '\0';
  buff[0x3e] = '\0';
  buff[0x3f] = '\0';
  lVar1 = archive_seek_data(a,-0x4eaf,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٲ',-1,"-1",lVar1,"archive_seek_data(a, -(20111+32), SEEK_END)",a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٳ',0x7e,"((sizeof(buff)-1)*2)",lVar1,"archive_seek_data(a, 0, SEEK_CUR)",a
                     );
  lVar2 = archive_read_data(a,buff,0x3f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٵ',0x3f,"(sizeof(buff)-1)",lVar2,
                      "archive_read_data(a, buff, (sizeof(buff)-1))",a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٶ',0xbd,"((sizeof(buff)-1)*3)",lVar1,"archive_seek_data(a, 0, SEEK_CUR)",a
                     );
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ٸ',"ml; charset=utf-8\">\n\t<TITLE></TITLE>\n\t<META NAME=\"GENERATOR\" CO",
             "\"ml; charset=utf-8\\\">\\n\\t<TITLE></TITLE>\\n\\t<META \" \"NAME=\\\"GENERATOR\\\" CO\""
             ,buff,"buff",a,L'\0');
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  buff[0x10] = '\0';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  buff[0x14] = '\0';
  buff[0x15] = '\0';
  buff[0x16] = '\0';
  buff[0x17] = '\0';
  buff[0x18] = '\0';
  buff[0x19] = '\0';
  buff[0x1a] = '\0';
  buff[0x1b] = '\0';
  buff[0x1c] = '\0';
  buff[0x1d] = '\0';
  buff[0x1e] = '\0';
  buff[0x1f] = '\0';
  buff[0x20] = '\0';
  buff[0x21] = '\0';
  buff[0x22] = '\0';
  buff[0x23] = '\0';
  buff[0x24] = '\0';
  buff[0x25] = '\0';
  buff[0x26] = '\0';
  buff[0x27] = '\0';
  buff[0x28] = '\0';
  buff[0x29] = '\0';
  buff[0x2a] = '\0';
  buff[0x2b] = '\0';
  buff[0x2c] = '\0';
  buff[0x2d] = '\0';
  buff[0x2e] = '\0';
  buff[0x2f] = '\0';
  buff[0x30] = '\0';
  buff[0x31] = '\0';
  buff[0x32] = '\0';
  buff[0x33] = '\0';
  buff[0x34] = '\0';
  buff[0x35] = '\0';
  buff[0x36] = '\0';
  buff[0x37] = '\0';
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  buff[0x3c] = '\0';
  buff[0x3d] = '\0';
  buff[0x3e] = '\0';
  buff[0x3f] = '\0';
  lVar1 = archive_seek_data(a,0x4e8f,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٻ',0x4e8f,"20111",lVar1,"archive_seek_data(a, 20111, SEEK_SET)",a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ټ',0x4e8f,"20111",lVar1,"archive_seek_data(a, 0, SEEK_CUR)",a);
  lVar2 = archive_read_data(a,buff,0x3f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٽ',0,"0",lVar2,"archive_read_data(a, buff, (sizeof(buff)-1))",a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'پ',0x4e8f,"20111",lVar1,"archive_seek_data(a, 0, SEEK_CUR)",a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ٿ',"","\"\"",buff,"buff",a,L'\0');
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  buff[0x10] = '\0';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  buff[0x14] = '\0';
  buff[0x15] = '\0';
  buff[0x16] = '\0';
  buff[0x17] = '\0';
  buff[0x18] = '\0';
  buff[0x19] = '\0';
  buff[0x1a] = '\0';
  buff[0x1b] = '\0';
  buff[0x1c] = '\0';
  buff[0x1d] = '\0';
  buff[0x1e] = '\0';
  buff[0x1f] = '\0';
  buff[0x20] = '\0';
  buff[0x21] = '\0';
  buff[0x22] = '\0';
  buff[0x23] = '\0';
  buff[0x24] = '\0';
  buff[0x25] = '\0';
  buff[0x26] = '\0';
  buff[0x27] = '\0';
  buff[0x28] = '\0';
  buff[0x29] = '\0';
  buff[0x2a] = '\0';
  buff[0x2b] = '\0';
  buff[0x2c] = '\0';
  buff[0x2d] = '\0';
  buff[0x2e] = '\0';
  buff[0x2f] = '\0';
  buff[0x30] = '\0';
  buff[0x31] = '\0';
  buff[0x32] = '\0';
  buff[0x33] = '\0';
  buff[0x34] = '\0';
  buff[0x35] = '\0';
  buff[0x36] = '\0';
  buff[0x37] = '\0';
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  buff[0x3c] = '\0';
  buff[0x3d] = '\0';
  buff[0x3e] = '\0';
  buff[0x3f] = '\0';
  lVar1 = archive_seek_data(a,0x3f,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ڂ',0x4ece,"20111 + (sizeof(buff)-1)",lVar1,
                      "archive_seek_data(a, (sizeof(buff)-1), SEEK_CUR)",a);
  lVar2 = archive_read_data(a,buff,0x3f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ڃ',0,"0",lVar2,"archive_read_data(a, buff, (sizeof(buff)-1))",a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'څ',0x4ece,"20111 + (sizeof(buff)-1)",lVar1,
                      "archive_seek_data(a, 0, SEEK_CUR)",a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'چ',"","\"\"",buff,"buff",a,L'\0');
  buff[0] = '\0';
  buff[1] = '\0';
  buff[2] = '\0';
  buff[3] = '\0';
  buff[4] = '\0';
  buff[5] = '\0';
  buff[6] = '\0';
  buff[7] = '\0';
  buff[8] = '\0';
  buff[9] = '\0';
  buff[10] = '\0';
  buff[0xb] = '\0';
  buff[0xc] = '\0';
  buff[0xd] = '\0';
  buff[0xe] = '\0';
  buff[0xf] = '\0';
  buff[0x10] = '\0';
  buff[0x11] = '\0';
  buff[0x12] = '\0';
  buff[0x13] = '\0';
  buff[0x14] = '\0';
  buff[0x15] = '\0';
  buff[0x16] = '\0';
  buff[0x17] = '\0';
  buff[0x18] = '\0';
  buff[0x19] = '\0';
  buff[0x1a] = '\0';
  buff[0x1b] = '\0';
  buff[0x1c] = '\0';
  buff[0x1d] = '\0';
  buff[0x1e] = '\0';
  buff[0x1f] = '\0';
  buff[0x20] = '\0';
  buff[0x21] = '\0';
  buff[0x22] = '\0';
  buff[0x23] = '\0';
  buff[0x24] = '\0';
  buff[0x25] = '\0';
  buff[0x26] = '\0';
  buff[0x27] = '\0';
  buff[0x28] = '\0';
  buff[0x29] = '\0';
  buff[0x2a] = '\0';
  buff[0x2b] = '\0';
  buff[0x2c] = '\0';
  buff[0x2d] = '\0';
  buff[0x2e] = '\0';
  buff[0x2f] = '\0';
  buff[0x30] = '\0';
  buff[0x31] = '\0';
  buff[0x32] = '\0';
  buff[0x33] = '\0';
  buff[0x34] = '\0';
  buff[0x35] = '\0';
  buff[0x36] = '\0';
  buff[0x37] = '\0';
  buff[0x38] = '\0';
  buff[0x39] = '\0';
  buff[0x3a] = '\0';
  buff[0x3b] = '\0';
  buff[0x3c] = '\0';
  buff[0x3d] = '\0';
  buff[0x3e] = '\0';
  buff[0x3f] = '\0';
  lVar1 = archive_seek_data(a,0x7e,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ډ',0x4f0d,"20111 + ((sizeof(buff)-1)*2)",lVar1,
                      "archive_seek_data(a, ((sizeof(buff)-1)*2), SEEK_END)",a);
  lVar2 = archive_read_data(a,buff,0x3f);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ڊ',0,"0",lVar2,"archive_read_data(a, buff, (sizeof(buff)-1))",a);
  lVar1 = archive_seek_data(a,0,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ڌ',0x4f0d,"20111 + ((sizeof(buff)-1)*2)",lVar1,
                      "archive_seek_data(a, 0, SEEK_CUR)",a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ڍ',"","\"\"",buff,"buff",a,L'\0');
  return;
}

Assistant:

static void
test_read_format_rar_multivolume_uncompressed_files_helper(struct archive *a)
{
  char buff[64];

  /* Do checks for seeks/reads past beginning and end of file */
  assertEqualIntA(a, 0, archive_seek_data(a, 0, SEEK_SET));
  memset(buff, 0, sizeof(buff));
  assertEqualIntA(a, -1, archive_seek_data(a, -((int)sizeof(buff)-1), SEEK_SET));
  assertEqualIntA(a, 0, archive_seek_data(a, 0, SEEK_CUR));
  assertEqualIntA(a, (sizeof(buff)-1),
    archive_read_data(a, buff, (sizeof(buff)-1)));
  assertEqualIntA(a, (sizeof(buff)-1), archive_seek_data(a, 0, SEEK_CUR));
  assertEqualStringA(a, "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD "
                        "HTML 4.0 Transitional//EN\">\n", buff);
  memset(buff, 0, sizeof(buff));
  assertEqualIntA(a, -1, archive_seek_data(a, -(((int)sizeof(buff)-1)*2), SEEK_CUR));
  assertEqualIntA(a, (sizeof(buff)-1), archive_seek_data(a, 0, SEEK_CUR));
  assertEqualIntA(a, (sizeof(buff)-1),
    archive_read_data(a, buff, (sizeof(buff)-1)));
  assertEqualIntA(a, ((sizeof(buff)-1)*2), archive_seek_data(a, 0, SEEK_CUR));
  assertEqualStringA(a, "<HTML>\n<HEAD>\n\t<META HTTP-EQUIV=\"CONTENT-TYPE\" "
                        "CONTENT=\"text/ht", buff);
  memset(buff, 0, sizeof(buff));
  assertEqualIntA(a, -1, archive_seek_data(a, -(20111+32), SEEK_END));
  assertEqualIntA(a, ((sizeof(buff)-1)*2), archive_seek_data(a, 0, SEEK_CUR));
  assertEqualIntA(a, (sizeof(buff)-1),
    archive_read_data(a, buff, (sizeof(buff)-1)));
  assertEqualIntA(a, ((sizeof(buff)-1)*3), archive_seek_data(a, 0, SEEK_CUR));
  assertEqualStringA(a, "ml; charset=utf-8\">\n\t<TITLE></TITLE>\n\t<META "
                        "NAME=\"GENERATOR\" CO", buff);

  memset(buff, 0, sizeof(buff));
  assertEqualIntA(a, 20111, archive_seek_data(a, 20111, SEEK_SET));
  assertEqualIntA(a, 20111, archive_seek_data(a, 0, SEEK_CUR));
  assertEqualIntA(a, 0, archive_read_data(a, buff, (sizeof(buff)-1)));
  assertEqualIntA(a, 20111, archive_seek_data(a, 0, SEEK_CUR));
  assertEqualStringA(a, "", buff);
  memset(buff, 0, sizeof(buff));
  assertEqualIntA(a, 20111 + (sizeof(buff)-1),
    archive_seek_data(a, (sizeof(buff)-1), SEEK_CUR));
  assertEqualIntA(a, 0, archive_read_data(a, buff, (sizeof(buff)-1)));
  assertEqualIntA(a, 20111 + (sizeof(buff)-1),
    archive_seek_data(a, 0, SEEK_CUR));
  assertEqualStringA(a, "", buff);
  memset(buff, 0, sizeof(buff));
  assertEqualIntA(a, 20111 + ((sizeof(buff)-1)*2),
    archive_seek_data(a, ((sizeof(buff)-1)*2), SEEK_END));
  assertEqualIntA(a, 0, archive_read_data(a, buff, (sizeof(buff)-1)));
  assertEqualIntA(a, 20111 + ((sizeof(buff)-1)*2),
    archive_seek_data(a, 0, SEEK_CUR));
  assertEqualStringA(a, "", buff);
}